

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_local_wall(REF_GRID ref_grid,REF_DICT ref_dict,REF_INT *node_per_ptr,REF_INT *param_4,
                   REF_DBL **param_5)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_BOOL RVar5;
  REF_CELL *ppRVar6;
  REF_DBL *pRVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  REF_CELL pRVar12;
  int iVar13;
  ulong uVar14;
  REF_INT bc;
  uint local_ec;
  ulong local_e8;
  int local_dc;
  REF_DICT local_d8;
  ulong local_d0;
  REF_GRID local_c8;
  REF_INT *local_c0;
  REF_INT *local_b8;
  REF_DBL **local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  ppRVar6 = ref_grid->cell;
  if (ref_grid->twod == 0) {
    ppRVar6 = ref_grid->cell + 3;
  }
  pRVar12 = *ppRVar6;
  local_d0 = (ulong)(uint)pRVar12->node_per;
  iVar13 = 0;
  local_d8 = ref_dict;
  local_c8 = ref_grid;
  local_c0 = node_per_ptr;
  local_b8 = param_4;
  local_b0 = param_5;
  for (iVar9 = 0; iVar9 < pRVar12->max; iVar9 = iVar9 + 1) {
    RVar3 = ref_cell_nodes(pRVar12,iVar9,nodes);
    if (RVar3 == 0) {
      bc = -1;
      uVar4 = ref_dict_value(local_d8,nodes[pRVar12->node_per],&bc);
      if ((uVar4 != 0) && (uVar4 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x5f4,"ref_phys_local_wall",(ulong)uVar4,"bc");
        local_ec = uVar4;
      }
      if ((uVar4 != 5) && (uVar4 != 0)) {
        return local_ec;
      }
      RVar5 = ref_phys_wall_distance_bc(bc);
      iVar13 = iVar13 + RVar5;
    }
  }
  if (local_c8->twod == 0) {
    pRVar12 = local_c8->cell[6];
    for (iVar9 = 0; iVar9 < pRVar12->max; iVar9 = iVar9 + 1) {
      RVar3 = ref_cell_nodes(pRVar12,iVar9,nodes);
      iVar10 = iVar13;
      if (RVar3 == 0) {
        bc = -1;
        uVar4 = ref_dict_value(local_d8,nodes[pRVar12->node_per],&bc);
        if ((uVar4 != 0) && (uVar4 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x5fe,"ref_phys_local_wall",(ulong)uVar4,"bc");
          local_ec = uVar4;
        }
        if ((uVar4 != 5) && (uVar4 != 0)) {
          return local_ec;
        }
        RVar5 = ref_phys_wall_distance_bc(bc);
        iVar10 = iVar13 + 2;
        if (RVar5 == 0) {
          iVar10 = iVar13;
        }
      }
      iVar13 = iVar10;
    }
    pRVar12 = local_c8->cell[3];
  }
  local_dc = (int)local_d0 * 3;
  if (iVar13 * local_dc < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
           "ref_phys_local_wall","malloc local_xyz of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    pRVar7 = (REF_DBL *)malloc((ulong)(uint)(iVar13 * local_dc) << 3);
    if (pRVar7 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
             "ref_phys_local_wall","malloc local_xyz of REF_DBL NULL");
      RVar3 = 2;
    }
    else {
      uVar14 = 0;
      if (0 < (int)local_d0) {
        uVar14 = local_d0 & 0xffffffff;
      }
      local_e8 = 0;
      for (iVar9 = 0; iVar9 < pRVar12->max; iVar9 = iVar9 + 1) {
        RVar3 = ref_cell_nodes(pRVar12,iVar9,nodes);
        if (RVar3 == 0) {
          bc = -1;
          uVar4 = ref_dict_value(local_d8,nodes[pRVar12->node_per],&bc);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x60a,"ref_phys_local_wall",(ulong)uVar4,"bc");
            local_ec = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return local_ec;
          }
          RVar5 = ref_phys_wall_distance_bc(bc);
          if (RVar5 != 0) {
            iVar13 = (int)local_e8 * local_dc;
            for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
              iVar10 = nodes[uVar8];
              pRVar2 = pRVar1->real;
              for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                pRVar7[iVar13 + (int)lVar11] = pRVar2[iVar10 * 0xf + lVar11];
              }
              iVar13 = iVar13 + 3;
            }
            local_e8 = (ulong)((int)local_e8 + 1);
          }
        }
      }
      if (local_c8->twod == 0) {
        pRVar12 = local_c8->cell[6];
        for (iVar9 = 0; iVar9 < pRVar12->max; iVar9 = iVar9 + 1) {
          RVar3 = ref_cell_nodes(pRVar12,iVar9,nodes);
          if (RVar3 == 0) {
            bc = -1;
            uVar4 = ref_dict_value(local_d8,nodes[pRVar12->node_per],&bc);
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x61a,"ref_phys_local_wall",(ulong)uVar4,"bc");
              local_ec = uVar4;
            }
            if ((uVar4 != 5) && (uVar4 != 0)) {
              return local_ec;
            }
            RVar5 = ref_phys_wall_distance_bc(bc);
            if (RVar5 != 0) {
              pRVar2 = pRVar1->real;
              iVar10 = (int)local_e8;
              iVar13 = iVar10 * local_dc;
              for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                pRVar7[iVar13 + lVar11] = pRVar2[nodes[0] * 0xf + lVar11];
                pRVar7[iVar13 + (int)lVar11 + 3] = pRVar2[nodes[1] * 0xf + lVar11];
                pRVar7[iVar13 + (int)lVar11 + 6] = pRVar2[nodes[2] * 0xf + lVar11];
              }
              iVar13 = (iVar10 + 1) * local_dc;
              for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
                pRVar7[iVar13 + lVar11] = pRVar2[nodes[0] * 0xf + lVar11];
                pRVar7[iVar13 + (int)lVar11 + 3] = pRVar2[nodes[2] * 0xf + lVar11];
                pRVar7[iVar13 + (int)lVar11 + 6] = pRVar2[nodes[3] * 0xf + lVar11];
              }
              local_e8 = (ulong)(iVar10 + 2);
            }
          }
        }
      }
      *local_c0 = (REF_INT)local_d0;
      *local_b8 = (REF_INT)local_e8;
      *local_b0 = pRVar7;
      RVar3 = 0;
    }
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_local_wall(REF_GRID ref_grid,
                                              REF_DICT ref_dict,
                                              REF_INT *node_per_ptr,
                                              REF_INT *local_ncell_ptr,
                                              REF_DBL **local_xyz_ptr) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT local_ncell;
  REF_DBL *local_xyz;
  REF_INT node_per;
  REF_CELL ref_cell;
  REF_INT i, node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT bc;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  node_per = ref_cell_node_per(ref_cell);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        local_ncell += 2;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }
  ref_malloc(local_xyz, 3 * node_per * local_ncell, REF_DBL);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      for (node = 0; node < node_per; node++) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * node + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[node]);
        }
      }
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[1]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
        }
        local_ncell += 1;
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[3]);
        }
        local_ncell += 1;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }

  *node_per_ptr = node_per;
  *local_ncell_ptr = local_ncell;
  *local_xyz_ptr = local_xyz;

  return REF_SUCCESS;
}